

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsFederate
helicsCreateCombinationFederate(char *fedName,HelicsFederateInfo fedInfo,HelicsError *err)

{
  pointer ppVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  HelicsFederate pvVar4;
  element_type *peVar5;
  _Alloc_hider _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  CombinationFederate *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  shared_ptr<helics::Federate> local_1d8;
  undefined1 local_1c8 [424];
  
  if (err == (HelicsError *)0x0) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
LAB_0019e040:
      paVar2 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar2;
      if (fedName == (char *)0x0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                   gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                   gHelicsEmptyStr_abi_cxx11_._M_string_length);
      }
      else {
        sVar3 = strlen(fedName);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,fedName,fedName + sVar3);
      }
      helics::FederateInfo::FederateInfo((FederateInfo *)local_1c8);
      local_1e8 = (CombinationFederate *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,std::__cxx11::string_const,helics::FederateInfo>
                (&_Stack_1e0,&local_1e8,(allocator<helics::CombinationFederate> *)&local_209,
                 &local_208,(FederateInfo *)local_1c8);
      local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_1e0._M_pi;
      if (local_1e8 == (CombinationFederate *)0x0) {
        peVar5 = (element_type *)0x0;
      }
      else {
        peVar5 = (element_type *)
                 ((long)&(local_1e8->super_ValueFederate)._vptr_ValueFederate +
                 (long)(local_1e8->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      local_1e8 = (CombinationFederate *)0x0;
      _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::FederateInfo::~FederateInfo((FederateInfo *)local_1c8);
      _Var6._M_p = local_208._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
LAB_0019e162:
        operator_delete(_Var6._M_p,
                        (ulong)((long)&((pointer)local_208.field_2._M_allocated_capacity)->first + 1
                               ));
      }
    }
    else {
      if (*(int *)((long)fedInfo + 0x48) != 0x6bfbbce1) goto LAB_0019e1ed;
LAB_0019e00f:
      ppVar1 = (pointer)(local_1c8 + 0x10);
      local_1c8._0_8_ = ppVar1;
      if (fedName == (char *)0x0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                   gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                   gHelicsEmptyStr_abi_cxx11_._M_string_length);
      }
      else {
        sVar3 = strlen(fedName);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,fedName,fedName + sVar3)
        ;
      }
      local_208._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,std::__cxx11::string_const,helics::FederateInfo&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_208._M_string_length,
                 (CombinationFederate **)&local_208,
                 (allocator<helics::CombinationFederate> *)&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 (FederateInfo *)fedInfo);
      local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._M_string_length;
      if ((long *)local_208._M_dataplus._M_p == (long *)0x0) {
        peVar5 = (element_type *)0x0;
      }
      else {
        peVar5 = (element_type *)
                 (local_208._M_dataplus._M_p +
                 *(long *)(*(long *)local_208._M_dataplus._M_p + -0x18));
      }
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = local_1c8._16_8_;
      _Var6._M_p = (pointer)local_1c8._0_8_;
      if ((pointer)local_1c8._0_8_ != ppVar1) goto LAB_0019e162;
    }
    local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    pvVar4 = generateNewHelicsFederateObject(&local_1d8,COMBINATION);
    if (local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    if (err->error_code == 0) {
      if (fedInfo == (HelicsFederateInfo)0x0) goto LAB_0019e040;
      if (*(int *)((long)fedInfo + 0x48) == 0x6bfbbce1) goto LAB_0019e00f;
      err->error_code = -3;
      err->message = "helics Federate info object was not valid";
    }
LAB_0019e1ed:
    pvVar4 = (HelicsFederate)0x0;
  }
  return pvVar4;
}

Assistant:

HelicsFederate helicsCreateCombinationFederate(const char* fedName, HelicsFederateInfo fedInfo, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        if (fedInfo == nullptr) {
            fed = std::make_shared<helics::CombinationFederate>(AS_STRING(fedName), helics::FederateInfo());
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            fed = std::make_shared<helics::CombinationFederate>(AS_STRING(fedName), *info);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::COMBINATION);
}